

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O1

int TVMStreamStreamSynchronize
              (int device_type,int device_id,TVMStreamHandle src,TVMStreamHandle dst)

{
  DeviceAPIManager *this;
  DeviceAPI *pDVar1;
  
  this = tvm::runtime::DeviceAPIManager::Global();
  pDVar1 = tvm::runtime::DeviceAPIManager::GetAPI(this,device_type,false);
  (*pDVar1->_vptr_DeviceAPI[0xb])(pDVar1,CONCAT44(device_id,device_type),src,dst);
  return 0;
}

Assistant:

int TVMStreamStreamSynchronize(int device_type,
                               int device_id,
                               TVMStreamHandle src,
                               TVMStreamHandle dst) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  DeviceAPIManager::Get(ctx)->SyncStreamFromTo(ctx, src, dst);
  API_END();
}